

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

deUint32 tcu::computeFloatFlushRelaxedULPDiff(float a,float b)

{
  deBool dVar1;
  deInt32 dVar2;
  deInt32 dVar3;
  deUint32 dVar4;
  deInt32 bIndex;
  deInt32 aIndex;
  float b_local;
  float a_local;
  
  dVar1 = deIsNaN((double)a);
  if ((dVar1 != 0) && (dVar1 = deIsNaN((double)b), dVar1 != 0)) {
    return 0;
  }
  dVar1 = deIsNaN((double)a);
  if ((dVar1 == 0) && (dVar1 = deIsNaN((double)b), dVar1 == 0)) {
    dVar2 = getPositionOfIEEEFloatWithoutDenormals(a);
    dVar3 = getPositionOfIEEEFloatWithoutDenormals(b);
    dVar4 = de::abs<int>(dVar2 - dVar3);
    return dVar4;
  }
  return 0xffffffff;
}

Assistant:

static deUint32 computeFloatFlushRelaxedULPDiff (float a, float b)
{
	if (deIsNaN(a) && deIsNaN(b))
		return 0;
	else if (deIsNaN(a) || deIsNaN(b))
	{
		return 0xFFFFFFFFu;
	}
	else
	{
		// Using the "definition 5" in Muller, Jean-Michel. "On the definition of ulp (x)" (2005)
		// assuming a floating point space is IEEE single precision floating point space without
		// denormals (and signed zeros).
		const deInt32 aIndex = getPositionOfIEEEFloatWithoutDenormals(a);
		const deInt32 bIndex = getPositionOfIEEEFloatWithoutDenormals(b);
		return (deUint32)de::abs(aIndex - bIndex);
	}
}